

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  byte bVar32;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar33;
  bool bVar34;
  long lVar35;
  byte bVar36;
  byte bVar37;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar38;
  size_t sVar39;
  Primitive *prim;
  bool bVar40;
  ulong uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar59 [64];
  long lStack_24e0;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar55 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    auVar54 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    auVar55 = ZEXT1664(auVar54);
  }
  pSVar38 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar52._4_4_ = fVar1;
  auVar52._0_4_ = fVar1;
  auVar52._8_4_ = fVar1;
  auVar52._12_4_ = fVar1;
  auVar52._16_4_ = fVar1;
  auVar52._20_4_ = fVar1;
  auVar52._24_4_ = fVar1;
  auVar52._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar53._4_4_ = fVar2;
  auVar53._0_4_ = fVar2;
  auVar53._8_4_ = fVar2;
  auVar53._12_4_ = fVar2;
  auVar53._16_4_ = fVar2;
  auVar53._20_4_ = fVar2;
  auVar53._24_4_ = fVar2;
  auVar53._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar56._4_4_ = fVar3;
  auVar56._0_4_ = fVar3;
  auVar56._8_4_ = fVar3;
  auVar56._12_4_ = fVar3;
  auVar56._16_4_ = fVar3;
  auVar56._20_4_ = fVar3;
  auVar56._24_4_ = fVar3;
  auVar56._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar48._4_4_ = uVar4;
  auVar48._0_4_ = uVar4;
  auVar48._8_4_ = uVar4;
  auVar48._12_4_ = uVar4;
  auVar48._16_4_ = uVar4;
  auVar48._20_4_ = uVar4;
  auVar48._24_4_ = uVar4;
  auVar48._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar50._4_4_ = uVar4;
  auVar50._0_4_ = uVar4;
  auVar50._8_4_ = uVar4;
  auVar50._12_4_ = uVar4;
  auVar50._16_4_ = uVar4;
  auVar50._20_4_ = uVar4;
  auVar50._24_4_ = uVar4;
  auVar50._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar45._4_4_ = uVar4;
  auVar45._0_4_ = uVar4;
  auVar45._8_4_ = uVar4;
  auVar45._12_4_ = uVar4;
  auVar45._16_4_ = uVar4;
  auVar45._20_4_ = uVar4;
  auVar45._24_4_ = uVar4;
  auVar45._28_4_ = uVar4;
  bVar34 = false;
  auVar22 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar57 = ZEXT3264(auVar22);
  auVar58 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar22 = vsubps_avx(auVar52,auVar48);
    fVar11 = auVar48._0_4_;
    fVar12 = auVar48._4_4_;
    fVar13 = auVar48._8_4_;
    fVar14 = auVar48._12_4_;
    fVar15 = auVar48._16_4_;
    fVar16 = auVar48._20_4_;
    fVar17 = auVar48._24_4_;
    auVar18 = vsubps_avx(auVar53,auVar50);
    auVar19 = vsubps_avx(auVar56,auVar45);
    auVar51._0_4_ = fVar3 + auVar45._0_4_;
    auVar51._4_4_ = fVar3 + auVar45._4_4_;
    auVar51._8_4_ = fVar3 + auVar45._8_4_;
    auVar51._12_4_ = fVar3 + auVar45._12_4_;
    auVar51._16_4_ = fVar3 + auVar45._16_4_;
    auVar51._20_4_ = fVar3 + auVar45._20_4_;
    auVar51._24_4_ = fVar3 + auVar45._24_4_;
    auVar51._28_4_ = fVar3 + auVar45._28_4_;
    auVar59._0_4_ = fVar11 * fVar11;
    auVar59._4_4_ = fVar12 * fVar12;
    auVar59._8_4_ = fVar13 * fVar13;
    auVar59._12_4_ = fVar14 * fVar14;
    auVar59._16_4_ = fVar15 * fVar15;
    auVar59._20_4_ = fVar16 * fVar16;
    auVar59._28_36_ = in_ZMM15._28_36_;
    auVar59._24_4_ = fVar17 * fVar17;
    auVar54 = auVar55._0_16_;
LAB_01c7efa2:
    do {
      if (pSVar38 == stack) {
        return bVar34;
      }
      pSVar33 = pSVar38 + -1;
      pSVar38 = pSVar38 + -1;
    } while (auVar55._0_4_ < (float)pSVar33->dist);
    sVar39 = (pSVar38->ptr).ptr;
LAB_01c7efc1:
    while (context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar39 & 8) != 0) goto LAB_01c7f406;
      auVar45 = *(undefined1 (*) [32])(sVar39 + 0x40);
      auVar20 = *(undefined1 (*) [32])(sVar39 + 0x60);
      auVar42 = vmaxps_avx(auVar52,auVar45);
      auVar42 = vminps_avx(auVar42,auVar20);
      auVar44 = vsubps_avx(auVar42,auVar52);
      auVar42 = vmaxps_avx(auVar53,*(undefined1 (*) [32])(sVar39 + 0x80));
      auVar42 = vminps_avx(auVar42,*(undefined1 (*) [32])(sVar39 + 0xa0));
      auVar43 = vsubps_avx(auVar42,auVar53);
      auVar42 = vmaxps_avx(auVar56,*(undefined1 (*) [32])(sVar39 + 0xc0));
      auVar42 = vminps_avx(auVar42,*(undefined1 (*) [32])(sVar39 + 0xe0));
      auVar42 = vsubps_avx(auVar42,auVar56);
      auVar49._0_4_ =
           auVar44._0_4_ * auVar44._0_4_ + auVar43._0_4_ * auVar43._0_4_ +
           auVar42._0_4_ * auVar42._0_4_;
      auVar49._4_4_ =
           auVar44._4_4_ * auVar44._4_4_ + auVar43._4_4_ * auVar43._4_4_ +
           auVar42._4_4_ * auVar42._4_4_;
      auVar49._8_4_ =
           auVar44._8_4_ * auVar44._8_4_ + auVar43._8_4_ * auVar43._8_4_ +
           auVar42._8_4_ * auVar42._8_4_;
      auVar49._12_4_ =
           auVar44._12_4_ * auVar44._12_4_ + auVar43._12_4_ * auVar43._12_4_ +
           auVar42._12_4_ * auVar42._12_4_;
      auVar49._16_4_ =
           auVar44._16_4_ * auVar44._16_4_ + auVar43._16_4_ * auVar43._16_4_ +
           auVar42._16_4_ * auVar42._16_4_;
      auVar49._20_4_ =
           auVar44._20_4_ * auVar44._20_4_ + auVar43._20_4_ * auVar43._20_4_ +
           auVar42._20_4_ * auVar42._20_4_;
      auVar49._24_4_ =
           auVar44._24_4_ * auVar44._24_4_ + auVar43._24_4_ * auVar43._24_4_ +
           auVar42._24_4_ * auVar42._24_4_;
      auVar49._28_4_ = auVar44._28_4_ + auVar43._28_4_ + auVar43._28_4_;
      uVar31 = vcmpps_avx512vl(auVar45,auVar20,2);
      uVar25 = vcmpps_avx512vl(auVar20,auVar22,1);
      auVar42._4_4_ = fVar1 + fVar12;
      auVar42._0_4_ = fVar1 + fVar11;
      auVar42._8_4_ = fVar1 + fVar13;
      auVar42._12_4_ = fVar1 + fVar14;
      auVar42._16_4_ = fVar1 + fVar15;
      auVar42._20_4_ = fVar1 + fVar16;
      auVar42._24_4_ = fVar1 + fVar17;
      auVar42._28_4_ = fVar1 + auVar48._28_4_;
      uVar26 = vcmpps_avx512vl(auVar45,auVar42,6);
      uVar27 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar39 + 0xa0),auVar18,1);
      auVar20._4_4_ = fVar2 + auVar50._4_4_;
      auVar20._0_4_ = fVar2 + auVar50._0_4_;
      auVar20._8_4_ = fVar2 + auVar50._8_4_;
      auVar20._12_4_ = fVar2 + auVar50._12_4_;
      auVar20._16_4_ = fVar2 + auVar50._16_4_;
      auVar20._20_4_ = fVar2 + auVar50._20_4_;
      auVar20._24_4_ = fVar2 + auVar50._24_4_;
      auVar20._28_4_ = fVar2 + auVar50._28_4_;
      uVar28 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar39 + 0x80),auVar20,6);
      uVar29 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar39 + 0xe0),auVar19,1);
      uVar30 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar39 + 0xc0),auVar51,6);
      uVar41 = (ulong)(byte)(~((byte)uVar28 | (byte)uVar26 | (byte)uVar30 | (byte)uVar25 |
                              (byte)uVar27 | (byte)uVar29) & (byte)uVar31);
LAB_01c7f044:
      bVar37 = (byte)uVar41;
      if (bVar37 == 0) goto LAB_01c7efa2;
      auVar45 = *(undefined1 (*) [32])(sVar39 & 0xfffffffffffffff0);
      auVar20 = ((undefined1 (*) [32])(sVar39 & 0xfffffffffffffff0))[1];
      auVar42 = vpternlogd_avx512vl(auVar57._0_32_,auVar49,auVar58._0_32_,0xf8);
      auVar43 = vpcompressd_avx512vl(auVar42);
      auVar44._0_4_ = (uint)(bVar37 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar42._0_4_
      ;
      bVar40 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar44._4_4_ = (uint)bVar40 * auVar43._4_4_ | (uint)!bVar40 * auVar42._4_4_;
      bVar40 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar44._8_4_ = (uint)bVar40 * auVar43._8_4_ | (uint)!bVar40 * auVar42._8_4_;
      bVar40 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar44._12_4_ = (uint)bVar40 * auVar43._12_4_ | (uint)!bVar40 * auVar42._12_4_;
      bVar40 = (bool)((byte)(uVar41 >> 4) & 1);
      auVar44._16_4_ = (uint)bVar40 * auVar43._16_4_ | (uint)!bVar40 * auVar42._16_4_;
      bVar40 = (bool)((byte)(uVar41 >> 5) & 1);
      auVar44._20_4_ = (uint)bVar40 * auVar43._20_4_ | (uint)!bVar40 * auVar42._20_4_;
      bVar40 = (bool)((byte)(uVar41 >> 6) & 1);
      auVar44._24_4_ = (uint)bVar40 * auVar43._24_4_ | (uint)!bVar40 * auVar42._24_4_;
      bVar40 = SUB81(uVar41 >> 7,0);
      auVar44._28_4_ = (uint)bVar40 * auVar43._28_4_ | (uint)!bVar40 * auVar42._28_4_;
      auVar42 = vpermt2q_avx512vl(auVar45,auVar44,auVar20);
      sVar39 = auVar42._0_8_;
      bVar37 = bVar37 - 1 & bVar37;
      if (bVar37 != 0) goto LAB_01c7f182;
    }
    if ((sVar39 & 8) == 0) {
      auVar45 = vmaxps_avx(auVar52,*(undefined1 (*) [32])(sVar39 + 0x40));
      auVar45 = vminps_avx(auVar45,*(undefined1 (*) [32])(sVar39 + 0x60));
      auVar20 = vsubps_avx(auVar45,auVar52);
      auVar45 = vmaxps_avx(auVar53,*(undefined1 (*) [32])(sVar39 + 0x80));
      auVar45 = vminps_avx(auVar45,*(undefined1 (*) [32])(sVar39 + 0xa0));
      auVar42 = vsubps_avx(auVar45,auVar53);
      auVar45 = vmaxps_avx(auVar56,*(undefined1 (*) [32])(sVar39 + 0xc0));
      auVar45 = vminps_avx(auVar45,*(undefined1 (*) [32])(sVar39 + 0xe0));
      auVar45 = vsubps_avx(auVar45,auVar56);
      auVar49._0_4_ =
           auVar20._0_4_ * auVar20._0_4_ + auVar42._0_4_ * auVar42._0_4_ +
           auVar45._0_4_ * auVar45._0_4_;
      auVar49._4_4_ =
           auVar20._4_4_ * auVar20._4_4_ + auVar42._4_4_ * auVar42._4_4_ +
           auVar45._4_4_ * auVar45._4_4_;
      auVar49._8_4_ =
           auVar20._8_4_ * auVar20._8_4_ + auVar42._8_4_ * auVar42._8_4_ +
           auVar45._8_4_ * auVar45._8_4_;
      auVar49._12_4_ =
           auVar20._12_4_ * auVar20._12_4_ + auVar42._12_4_ * auVar42._12_4_ +
           auVar45._12_4_ * auVar45._12_4_;
      auVar49._16_4_ =
           auVar20._16_4_ * auVar20._16_4_ + auVar42._16_4_ * auVar42._16_4_ +
           auVar45._16_4_ * auVar45._16_4_;
      auVar49._20_4_ =
           auVar20._20_4_ * auVar20._20_4_ + auVar42._20_4_ * auVar42._20_4_ +
           auVar45._20_4_ * auVar45._20_4_;
      auVar49._24_4_ =
           auVar20._24_4_ * auVar20._24_4_ + auVar42._24_4_ * auVar42._24_4_ +
           auVar45._24_4_ * auVar45._24_4_;
      auVar49._28_4_ = auVar20._28_4_ + auVar42._28_4_ + auVar42._28_4_;
      uVar41 = vcmpps_avx512vl(auVar49,auVar59._0_32_,2);
      uVar24 = vcmpps_avx512vl(*(undefined1 (*) [32])(sVar39 + 0x40),
                               *(undefined1 (*) [32])(sVar39 + 0x60),2);
      uVar41 = uVar41 & uVar24;
      goto LAB_01c7f044;
    }
LAB_01c7f406:
    lVar35 = (ulong)((uint)sVar39 & 0xf) - 8;
    prim = (Primitive *)(sVar39 & 0xfffffffffffffff0);
    bVar37 = 0;
    while( true ) {
      in_ZMM15 = ZEXT3264(auVar59._0_32_);
      bVar40 = lVar35 == 0;
      lVar35 = lVar35 + -1;
      if (bVar40) break;
      bVar40 = InstanceArrayIntersector1::pointQuery(query,context,prim);
      auVar58 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      auVar45 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar57 = ZEXT3264(auVar45);
      bVar37 = bVar37 | bVar40;
      prim = prim + 1;
    }
    auVar55 = ZEXT1664(auVar54);
    if (bVar37 == 0) goto LAB_01c7efa2;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar48._4_4_ = uVar4;
    auVar48._0_4_ = uVar4;
    auVar48._8_4_ = uVar4;
    auVar48._12_4_ = uVar4;
    auVar48._16_4_ = uVar4;
    auVar48._20_4_ = uVar4;
    auVar48._24_4_ = uVar4;
    auVar48._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar50._4_4_ = uVar4;
    auVar50._0_4_ = uVar4;
    auVar50._8_4_ = uVar4;
    auVar50._12_4_ = uVar4;
    auVar50._16_4_ = uVar4;
    auVar50._20_4_ = uVar4;
    auVar50._24_4_ = uVar4;
    auVar50._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar45._4_4_ = uVar4;
    auVar45._0_4_ = uVar4;
    auVar45._8_4_ = uVar4;
    auVar45._12_4_ = uVar4;
    auVar45._16_4_ = uVar4;
    auVar45._20_4_ = uVar4;
    auVar45._24_4_ = uVar4;
    auVar45._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar55 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      auVar54 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar55 = ZEXT1664(auVar54);
    }
    bVar34 = true;
  } while( true );
LAB_01c7f182:
  auVar42 = vpshufd_avx2(auVar44,0x55);
  vpermt2q_avx512vl(auVar45,auVar42,auVar20);
  auVar43 = vpminsd_avx2(auVar44,auVar42);
  auVar42 = vpmaxsd_avx2(auVar44,auVar42);
  bVar37 = bVar37 - 1 & bVar37;
  if (bVar37 == 0) {
    auVar44 = vpermi2q_avx512vl(auVar43,auVar45,auVar20);
    sVar39 = auVar44._0_8_;
    auVar45 = vpermt2q_avx512vl(auVar45,auVar42,auVar20);
    (pSVar38->ptr).ptr = auVar45._0_8_;
    lVar35 = 8;
    lStack_24e0 = 0x10;
  }
  else {
    auVar23 = vpshufd_avx2(auVar44,0xaa);
    vpermt2q_avx512vl(auVar45,auVar23,auVar20);
    auVar47 = vpminsd_avx2(auVar43,auVar23);
    auVar43 = vpmaxsd_avx2(auVar43,auVar23);
    auVar23 = vpminsd_avx2(auVar42,auVar43);
    auVar43 = vpmaxsd_avx2(auVar42,auVar43);
    bVar37 = bVar37 - 1 & bVar37;
    if (bVar37 == 0) {
      auVar42 = vpermi2q_avx512vl(auVar47,auVar45,auVar20);
      sVar39 = auVar42._0_8_;
      auVar42 = vpermt2q_avx512vl(auVar45,auVar43,auVar20);
      (pSVar38->ptr).ptr = auVar42._0_8_;
      auVar42 = vpermd_avx2(auVar43,auVar49);
      pSVar38->dist = auVar42._0_4_;
      auVar45 = vpermt2q_avx512vl(auVar45,auVar23,auVar20);
      pSVar38[1].ptr.ptr = auVar45._0_8_;
      lStack_24e0 = 0x18;
      lVar35 = lStack_24e0;
      lStack_24e0 = 0x20;
      auVar42 = auVar23;
    }
    else {
      auVar42 = vpshufd_avx2(auVar44,0xff);
      vpermt2q_avx512vl(auVar45,auVar42,auVar20);
      auVar21 = vpminsd_avx2(auVar47,auVar42);
      auVar47 = vpmaxsd_avx2(auVar47,auVar42);
      auVar42 = vpminsd_avx2(auVar23,auVar47);
      auVar47 = vpmaxsd_avx2(auVar23,auVar47);
      auVar23 = vpminsd_avx2(auVar43,auVar47);
      auVar43 = vpmaxsd_avx2(auVar43,auVar47);
      bVar37 = bVar37 - 1 & bVar37;
      if (bVar37 != 0) {
        auVar46 = valignd_avx512vl(auVar44,auVar44,3);
        auVar44 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar47 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar44,auVar21);
        auVar44 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar42 = vpermt2d_avx512vl(auVar47,auVar44,auVar42);
        auVar44 = vpermt2d_avx512vl(auVar42,auVar44,auVar23);
        auVar42 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar42 = vpermt2d_avx512vl(auVar44,auVar42,auVar43);
        auVar55 = ZEXT3264(auVar42);
        bVar36 = bVar37;
        do {
          auVar44 = auVar55._0_32_;
          auVar43._8_4_ = 1;
          auVar43._0_8_ = 0x100000001;
          auVar43._12_4_ = 1;
          auVar43._16_4_ = 1;
          auVar43._20_4_ = 1;
          auVar43._24_4_ = 1;
          auVar43._28_4_ = 1;
          auVar42 = vpermd_avx2(auVar43,auVar46);
          auVar46 = valignd_avx512vl(auVar46,auVar46,1);
          vpermt2q_avx512vl(auVar45,auVar46,auVar20);
          bVar36 = bVar36 - 1 & bVar36;
          uVar31 = vpcmpd_avx512vl(auVar42,auVar44,5);
          auVar42 = vpmaxsd_avx2(auVar42,auVar44);
          bVar32 = (byte)uVar31 << 1;
          auVar44 = valignd_avx512vl(auVar44,auVar44,7);
          bVar40 = (bool)((byte)uVar31 & 1);
          bVar6 = (bool)(bVar32 >> 2 & 1);
          bVar7 = (bool)(bVar32 >> 3 & 1);
          bVar8 = (bool)(bVar32 >> 4 & 1);
          bVar9 = (bool)(bVar32 >> 5 & 1);
          bVar10 = (bool)(bVar32 >> 6 & 1);
          auVar55 = ZEXT3264(CONCAT428((uint)(bVar32 >> 7) * auVar44._28_4_ |
                                       (uint)!(bool)(bVar32 >> 7) * auVar42._28_4_,
                                       CONCAT424((uint)bVar10 * auVar44._24_4_ |
                                                 (uint)!bVar10 * auVar42._24_4_,
                                                 CONCAT420((uint)bVar9 * auVar44._20_4_ |
                                                           (uint)!bVar9 * auVar42._20_4_,
                                                           CONCAT416((uint)bVar8 * auVar44._16_4_ |
                                                                     (uint)!bVar8 * auVar42._16_4_,
                                                                     CONCAT412((uint)bVar7 *
                                                                               auVar44._12_4_ |
                                                                               (uint)!bVar7 *
                                                                               auVar42._12_4_,
                                                                               CONCAT48((uint)bVar6
                                                                                        * auVar44.
                                                  _8_4_ | (uint)!bVar6 * auVar42._8_4_,
                                                  CONCAT44((uint)bVar40 * auVar44._4_4_ |
                                                           (uint)!bVar40 * auVar42._4_4_,
                                                           auVar42._0_4_))))))));
        } while (bVar36 != 0);
        lVar35 = (ulong)(uint)POPCOUNT((uint)bVar37) + 3;
        while( true ) {
          auVar44 = auVar55._0_32_;
          auVar42 = vpermt2q_avx512vl(auVar45,auVar44,auVar20);
          sVar39 = auVar42._0_8_;
          bVar40 = lVar35 == 0;
          lVar35 = lVar35 + -1;
          if (bVar40) break;
          (pSVar38->ptr).ptr = sVar39;
          auVar42 = vpermd_avx2(auVar44,auVar49);
          pSVar38->dist = auVar42._0_4_;
          auVar42 = valignd_avx512vl(auVar44,auVar44,1);
          auVar55 = ZEXT3264(auVar42);
          pSVar38 = pSVar38 + 1;
        }
        auVar55 = ZEXT1664(auVar54);
        goto LAB_01c7efc1;
      }
      auVar44 = vpermi2q_avx512vl(auVar21,auVar45,auVar20);
      sVar39 = auVar44._0_8_;
      auVar44 = vpermt2q_avx512vl(auVar45,auVar43,auVar20);
      (pSVar38->ptr).ptr = auVar44._0_8_;
      auVar44 = vpermd_avx2(auVar43,auVar49);
      pSVar38->dist = auVar44._0_4_;
      auVar44 = vpermt2q_avx512vl(auVar45,auVar23,auVar20);
      pSVar38[1].ptr.ptr = auVar44._0_8_;
      auVar44 = vpermd_avx2(auVar23,auVar49);
      pSVar38[1].dist = auVar44._0_4_;
      auVar45 = vpermt2q_avx512vl(auVar45,auVar42,auVar20);
      pSVar38[2].ptr.ptr = auVar45._0_8_;
      lVar35 = 0x28;
      lStack_24e0 = 0x30;
    }
  }
  auVar45 = vpermd_avx2(auVar42,auVar49);
  *(int *)((long)&(pSVar38->ptr).ptr + lVar35) = auVar45._0_4_;
  pSVar38 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar38->ptr).ptr + lStack_24e0);
  goto LAB_01c7efc1;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }